

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z2.c
# Opt level: O2

LispPTR N_OP_classoc(LispPTR key,LispPTR list)

{
  uint uVar1;
  LispPTR LVar2;
  cadr_cell cVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = key & 0xfff0000;
  if ((((uVar1 == 0) || (uVar1 == 0x70000)) || (uVar1 == 0xf0000)) || (uVar1 == 0xe0000)) {
    if ((list != 0) &&
       ((*(ushort *)((ulong)(list >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5)) {
      cVar3 = cadr(list);
      uVar5 = 0xfffffffffffffffe;
      do {
        if (((*(ushort *)((ulong)(MDStypetbl + ((ulong)cVar3 >> 9 & 0x7fffff)) ^ 2) & 0x7ff) == 5)
           && (LVar2 = car(cVar3.car_cell), LVar2 == key)) goto LAB_00136908;
        if ((*(ushort *)((ulong)(MDStypetbl + ((ulong)cVar3 >> 0x29)) ^ 2) & 0x7ff) != 5) {
          cVar3.car_cell = 0;
          cVar3.cdr_cell = 0;
          LVar2 = 0;
          if (MachineState.irqend == 0) goto LAB_001368f4;
          goto LAB_00136908;
        }
        uVar4 = (ulong)cVar3 >> 0x20;
        LVar2 = cVar3.cdr_cell;
        cVar3 = cadr(LVar2);
        if (MachineState.irqend == 0) goto LAB_001368f4;
      } while (uVar4 != 0);
    }
    cVar3.car_cell = 0;
    cVar3.cdr_cell = 0;
  }
  else {
    uVar5 = 0xffffffffffffffff;
    LVar2 = list;
LAB_001368f4:
    MachineState.tosvalue = LVar2;
    MachineState.errorexit = 1;
    cVar3 = (cadr_cell)(uVar5 & 0xffffffff);
  }
LAB_00136908:
  return cVar3.car_cell;
}

Assistant:

LispPTR N_OP_classoc(LispPTR key, LispPTR list) {
  struct cadr_cell cadr1;
  LispPTR cdrcell; /* address of (cdr A-list); Lisp address */

  switch (key & SEGMASK) {
    case S_POSITIVE: break;
    case S_NEGATIVE: break;
    case S_CHARACTER: break;
    case ATOM_OFFSET: break;
    default: ERROR_EXIT(list);
  }
  /* JRB - Don Charnley claims the code below should be identical to the
        code in IL:ASSOC, so I copied my new and exciting version over */

  if (list == NIL_PTR) { return (NIL_PTR); }

  if (GetTypeNumber(list) != TYPE_LISTP) { return (NIL_PTR); }

  S_N_CHECKANDCADR(list, cadr1, list);

  do {
    cdrcell = cadr1.cdr_cell; /* the rest of A-list */
    if (Listp(cadr1.car_cell) && key == car(cadr1.car_cell)) {
      /* cons data found */
      return (cadr1.car_cell);
    }
    /* search the rest of A-list */
    if (Listp(cdrcell))
      cadr1 = cadr(cdrcell);
    else
      cdrcell = NIL;
    /* check for interrupts and punt to handle one safely */
    if (!Irq_Stk_End) {
      TopOfStack = cdrcell; /* for continuation */
      TIMER_EXIT(cdrcell);
    }
  } while (cdrcell != NIL_PTR);

  return (NIL_PTR);
}